

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesShaft.h
# Opt level: O1

void __thiscall chrono::ChVariablesShaft::ArchiveIN(ChVariablesShaft *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChVariablesShaft>(marchive);
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  this->m_inv_inertia = 1.0 / this->m_inertia;
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive) override {
        // version number
        /*int version =*/ marchive.VersionRead<ChVariablesShaft>();
        // deserialize parent class
        ChVariables::ArchiveIN(marchive);
        // stream in all member data:
        marchive >> CHNVP(m_inertia);
        SetInertia(m_inertia);
    }